

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode http_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  long *plVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  Curl_cfilter *pCVar5;
  byte bVar6;
  
  if ((cf->field_0x24 & 1) == 0) {
    plVar1 = (long *)cf->ctx;
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    pCVar5 = cf->next;
    while (CVar4 = (*pCVar5->cft->do_connect)(pCVar5,data,blocking,done), CVar4 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      *done = false;
      if (*plVar1 != 0) {
        cf->field_0x24 = cf->field_0x24 | 1;
        *done = true;
        return CURLE_OK;
      }
      _Var3 = Curl_conn_cf_is_ssl(cf->next);
      bVar6 = 2;
      if (_Var3) {
        bVar6 = cf->conn->proxy_alpn;
        if (2 < bVar6) {
          if (data == (Curl_easy *)0x0) {
            return CURLE_COULDNT_CONNECT;
          }
          if (((data->set).field_0x8cd & 0x10) == 0) {
            return CURLE_COULDNT_CONNECT;
          }
          pcVar2 = (data->state).feat;
          if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
            return CURLE_COULDNT_CONNECT;
          }
          Curl_infof(data,"CONNECT tunnel: unsupported ALPN(%d) negotiated",(ulong)(uint)bVar6);
          return CURLE_COULDNT_CONNECT;
        }
      }
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
          (((pcVar2 = (data->state).feat, pcVar2 != (curl_trc_feat *)0x0 && (pcVar2->log_level < 1))
           || ((cf->cft->log_level < 1 ||
               (Curl_trc_cf_infof(data,cf,"installing subfilter for HTTP/1.1"),
               ((data->set).field_0x8cd & 0x10) != 0)))))) &&
         ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
      {
        Curl_infof(data,"CONNECT tunnel: HTTP/1.%d negotiated",(ulong)(bVar6 != 1));
      }
      CVar4 = Curl_cf_h1_proxy_insert_after(cf,data);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      pCVar5 = cf->next;
      *plVar1 = (long)pCVar5;
    }
  }
  else {
    *done = true;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode http_proxy_cf_connect(struct Curl_cfilter *cf,
                                      struct Curl_easy *data,
                                      bool blocking, bool *done)
{
  struct cf_proxy_ctx *ctx = cf->ctx;
  CURLcode result;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
connect_sub:
  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ctx->cf_protocol) {
    struct Curl_cfilter *cf_protocol = NULL;
    int alpn = Curl_conn_cf_is_ssl(cf->next) ?
      cf->conn->proxy_alpn : CURL_HTTP_VERSION_1_1;

    /* First time call after the subchain connected */
    switch(alpn) {
    case CURL_HTTP_VERSION_NONE:
    case CURL_HTTP_VERSION_1_0:
    case CURL_HTTP_VERSION_1_1:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/1.1");
      infof(data, "CONNECT tunnel: HTTP/1.%d negotiated",
            (alpn == CURL_HTTP_VERSION_1_0) ? 0 : 1);
      result = Curl_cf_h1_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#ifdef USE_NGHTTP2
    case CURL_HTTP_VERSION_2:
      CURL_TRC_CF(data, cf, "installing subfilter for HTTP/2");
      infof(data, "CONNECT tunnel: HTTP/2 negotiated");
      result = Curl_cf_h2_proxy_insert_after(cf, data);
      if(result)
        goto out;
      cf_protocol = cf->next;
      break;
#endif
    default:
      infof(data, "CONNECT tunnel: unsupported ALPN(%d) negotiated", alpn);
      result = CURLE_COULDNT_CONNECT;
      goto out;
    }

    ctx->cf_protocol = cf_protocol;
    /* after we installed the filter "below" us, we call connect
     * on out sub-chain again.
     */
    goto connect_sub;
  }
  else {
    /* subchain connected and we had already installed the protocol filter.
     * This means the protocol tunnel is established, we are done.
     */
    DEBUGASSERT(ctx->cf_protocol);
    result = CURLE_OK;
  }

out:
  if(!result) {
    cf->connected = TRUE;
    *done = TRUE;
  }
  return result;
}